

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::_::
concat<kj::CappedArray<char,5ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,5ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,5ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
          (String *__return_storage_ptr__,_ *this,CappedArray<char,_5UL> *params,
          ArrayPtr<const_char> *params_1,CappedArray<char,_5UL> *params_2,
          ArrayPtr<const_char> *params_3,CappedArray<char,_5UL> *params_4,
          ArrayPtr<const_char> *params_5,ArrayPtr<const_char> *params_6)

{
  long lVar1;
  size_t size;
  char *target;
  long local_68 [2];
  char *local_58;
  undefined8 local_50;
  char *local_48;
  undefined8 local_40;
  size_t local_38;
  
  local_68[0] = *(long *)this;
  local_68[1]._0_1_ = params->content[0];
  local_68[1]._1_1_ = params->content[1];
  local_68[1]._2_1_ = params->content[2];
  local_68[1]._3_1_ = params->content[3];
  local_68[1]._4_1_ = params->content[4];
  local_68[1]._5_3_ = *(undefined3 *)&params->field_0xd;
  local_58 = params_1->ptr;
  local_50._0_1_ = params_2->content[0];
  local_50._1_1_ = params_2->content[1];
  local_50._2_1_ = params_2->content[2];
  local_50._3_1_ = params_2->content[3];
  local_50._4_1_ = params_2->content[4];
  local_50._5_3_ = *(undefined3 *)&params_2->field_0xd;
  local_48 = params_3->ptr;
  local_40._0_1_ = params_4->content[0];
  local_40._1_1_ = params_4->content[1];
  local_40._2_1_ = params_4->content[2];
  local_40._3_1_ = params_4->content[3];
  local_40._4_1_ = params_4->content[4];
  local_40._5_3_ = *(undefined3 *)&params_4->field_0xd;
  local_38 = params_5->size_;
  size = 0;
  lVar1 = 0;
  do {
    size = size + *(long *)((long)local_68 + lVar1);
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x38);
  heapString(__return_storage_ptr__,size);
  target = (char *)(__return_storage_ptr__->content).size_;
  if (target != (char *)0x0) {
    target = (__return_storage_ptr__->content).ptr;
  }
  fill<kj::CappedArray<char,5ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,5ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,5ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (target,(CappedArray<char,_5UL> *)this,(ArrayPtr<const_char> *)params,
             (CappedArray<char,_5UL> *)params_1,(ArrayPtr<const_char> *)params_2,
             (CappedArray<char,_5UL> *)params_3,(ArrayPtr<const_char> *)params_4,params_5);
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}